

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O2

void TestBignumDtoaVariousDoubles(void)

{
  undefined1 uVar1;
  int requested_digits;
  undefined1 uVar2;
  char *pcVar3;
  int *value_source;
  int *piVar5;
  int *length_00;
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  Vector<char> buffer_12;
  Vector<char> buffer_13;
  Vector<char> buffer_14;
  Vector<char> buffer_15;
  Vector<char> buffer_16;
  Vector<char> buffer_17;
  Vector<char> buffer_18;
  Vector<char> buffer_19;
  Vector<char> buffer_20;
  Vector<char> buffer_21;
  Vector<char> buffer_22;
  Vector<char> buffer_23;
  Vector<char> buffer_24;
  Vector<char> buffer_25;
  Vector<char> buffer_26;
  Vector<char> buffer_27;
  Vector<char> buffer_28;
  Vector<char> buffer_29;
  Vector<char> buffer_30;
  Vector<char> buffer_31;
  Vector<char> buffer_32;
  Vector<char> representation;
  Vector<char> representation_00;
  Vector<char> representation_01;
  Vector<char> representation_02;
  Vector<char> representation_03;
  Vector<char> representation_04;
  Vector<char> representation_05;
  Vector<char> representation_06;
  Vector<char> representation_07;
  Vector<char> representation_08;
  Vector<char> representation_09;
  Vector<char> representation_10;
  Vector<char> representation_11;
  Vector<char> representation_12;
  Vector<char> representation_13;
  Vector<char> representation_14;
  Vector<char> representation_15;
  Vector<char> representation_16;
  Vector<char> representation_17;
  int *in_stack_ffffffffffffff58;
  int point;
  int length;
  char buffer_container [100];
  int *piVar4;
  
  value_source = &length;
  length_00 = &point;
  buffer._8_8_ = value_source;
  buffer.start_ = (char *)0x64;
  requested_digits = (int)buffer_container;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,1.0,BIGNUM_DTOA_SHORTEST,requested_digits,buffer,length_00,
             in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x41,0xc080e4,"1",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x42,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_00._8_8_ = value_source;
  buffer_00.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,1.0,BIGNUM_DTOA_PRECISION,requested_digits,buffer_00,length_00
             ,in_stack_ffffffffffffff58);
  pcVar3 = "(3) >= (length - point)";
  CheckHelper((char *)0x45,0xc0ce1f,(char *)(ulong)(length - point < 4),(bool)uVar1);
  representation._8_8_ = pcVar3;
  representation.start_ = buffer_container;
  TrimRepresentation(representation);
  CheckEqualsHelper((char *)0x47,0xc080e4,"1",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x48,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_01._8_8_ = value_source;
  buffer_01.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,1.0,BIGNUM_DTOA_PRECISION,requested_digits,buffer_01,length_00
             ,in_stack_ffffffffffffff58);
  pcVar3 = "(3) >= (length)";
  CheckHelper((char *)0x4b,0xc0ce37,(char *)(ulong)(length < 4),(bool)uVar1);
  representation_00._8_8_ = pcVar3;
  representation_00.start_ = buffer_container;
  TrimRepresentation(representation_00);
  CheckEqualsHelper((char *)0x4d,0xc080e4,"1",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x4e,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  uVar2 = 100;
  buffer_02._8_8_ = value_source;
  buffer_02.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,1.5,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_02,length_00,
             in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x51,0xc0ce47,"15",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x52,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  buffer_03._8_8_ = value_source;
  buffer_03.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  uVar1 = uVar2;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,1.5,10,requested_digits,buffer_03,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(10) >= (length - point)";
  CheckHelper((char *)0x55,0xc0ce4c,(char *)(ulong)(length - point < 0xb),(bool)uVar1);
  representation_01._8_8_ = pcVar3;
  representation_01.start_ = buffer_container;
  TrimRepresentation(representation_01);
  CheckEqualsHelper((char *)0x57,0xc0ce47,"15",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x58,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_04._8_8_ = value_source;
  buffer_04.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,1.5,10,requested_digits,buffer_04,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(10) >= (length)";
  CheckHelper((char *)0x5b,0xc0ce65,(char *)(ulong)(length < 0xb),(bool)uVar1);
  representation_02._8_8_ = pcVar3;
  representation_02.start_ = buffer_container;
  TrimRepresentation(representation_02);
  CheckEqualsHelper((char *)0x5d,0xc0ce47,"15",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x5e,0xc1c254,(char *)0x1,point,(char *)piVar4,(int)piVar5);
  buffer_05._8_8_ = value_source;
  buffer_05.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,4.94065645841247e-324,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_05,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x62,0xc0ce76,"5",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x63,0xc0ce7a,(char *)0xfffffebd,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_06._8_8_ = value_source;
  buffer_06.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,4.94065645841247e-324,5,requested_digits,buffer_06,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(5) >= (length - point)";
  CheckHelper((char *)0x66,0xc0ce7f,(char *)(ulong)(length - point < 6),(bool)uVar1);
  representation_03._8_8_ = pcVar3;
  representation_03.start_ = buffer_container;
  TrimRepresentation(representation_03);
  CheckEqualsHelper((char *)0x68,0xc0ce97,"",buffer_container,(char *)piVar4,(char *)piVar5);
  uVar1 = 100;
  buffer_07._8_8_ = value_source;
  buffer_07.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,4.94065645841247e-324,5,requested_digits,buffer_07,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(5) >= (length)";
  CheckHelper((char *)0x6b,0xc0ce9a,(char *)(ulong)(length < 6),(bool)uVar1);
  representation_04._8_8_ = pcVar3;
  representation_04.start_ = buffer_container;
  TrimRepresentation(representation_04);
  CheckEqualsHelper((char *)0x6d,0xc0ceaa,"49407",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x6e,0xc0ce7a,(char *)0xfffffebd,point,(char *)piVar4,(int)piVar5);
  buffer_08._8_8_ = value_source;
  buffer_08.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,1.79769313486232e+308,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_08,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x72,0xc0ceb2,"17976931348623157",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x73,0xa6153b,(char *)0x135,point,(char *)piVar4,(int)piVar5);
  buffer_09._8_8_ = value_source;
  buffer_09.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,1.79769313486232e+308,7,requested_digits,buffer_09,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(7) >= (length)";
  CheckHelper((char *)0x76,0xc0ced8,(char *)(ulong)(length < 8),(bool)uVar2);
  representation_05._8_8_ = pcVar3;
  representation_05.start_ = buffer_container;
  TrimRepresentation(representation_05);
  CheckEqualsHelper((char *)0x78,0xc0cee8,"1797693",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0x79,0xa6153b,(char *)0x135,point,(char *)piVar4,(int)piVar5);
  buffer_10._8_8_ = value_source;
  buffer_10.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,4294967272.0,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_10,
             length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x7c,0xc0cefa,"4294967272",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x7d,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  buffer_11._8_8_ = value_source;
  buffer_11.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,4294967272.0,5,requested_digits,buffer_11,length_00,
             in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x80,0xc0cf12,"429496727200000",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x81,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_12._8_8_ = value_source;
  buffer_12.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,4294967272.0,0xe,requested_digits,buffer_12,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(14) >= (length)";
  CheckHelper((char *)0x85,0xc0cf34,(char *)(ulong)(length < 0xf),(bool)uVar1);
  representation_06._8_8_ = pcVar3;
  representation_06.start_ = buffer_container;
  TrimRepresentation(representation_06);
  CheckEqualsHelper((char *)0x87,0xc0cefa,"4294967272",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x88,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  uVar2 = 100;
  buffer_13._8_8_ = value_source;
  buffer_13.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,4.185580496821357e+298,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_13,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x8c,0xc0cf45,"4185580496821357",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x8d,0xaf8c1d,(char *)0x12b,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_14._8_8_ = value_source;
  buffer_14.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,4.185580496821357e+298,0x14,requested_digits,buffer_14,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(20) >= (length)";
  CheckHelper((char *)0x91,0xc0cf69,(char *)(ulong)(length < 0x15),(bool)uVar1);
  representation_07._8_8_ = pcVar3;
  representation_07.start_ = buffer_container;
  TrimRepresentation(representation_07);
  CheckEqualsHelper((char *)0x93,0xc0cf7a,"41855804968213567225",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x94,0xaf8c1d,(char *)0x12b,point,(char *)piVar4,(int)piVar5);
  buffer_15._8_8_ = value_source;
  buffer_15.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,5.562684646268003e-309,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_15,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0x98,0xc0cfa6,"5562684646268003",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0x99,0xc1fb9c,(char *)0xfffffecc,point,(char *)piVar4,(int)piVar5);
  buffer_16._8_8_ = value_source;
  buffer_16.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  uVar1 = uVar2;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,5.562684646268003e-309,BIGNUM_DTOA_SHORTEST_SINGLE,
             requested_digits,buffer_16,length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(1) >= (length)";
  CheckHelper((char *)0x9d,0xc0cfca,(char *)(ulong)(length < 2),(bool)uVar1);
  representation_08._8_8_ = pcVar3;
  representation_08.start_ = buffer_container;
  TrimRepresentation(representation_08);
  CheckEqualsHelper((char *)0x9f,0xc0cfda,"6",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0xa0,0xc1fb9c,(char *)0xfffffecc,point,(char *)piVar4,(int)piVar5);
  buffer_17._8_8_ = value_source;
  buffer_17.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,2147483648.0,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_17,
             length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xa4,0xc0cfde,"2147483648",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xa5,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  buffer_18._8_8_ = value_source;
  buffer_18.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,2147483648.0,BIGNUM_DTOA_FIXED,requested_digits,buffer_18,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(2) >= (length - point)";
  CheckHelper((char *)0xaa,0xc0cff6,(char *)(ulong)(length - point < 3),(bool)uVar2);
  representation_09._8_8_ = pcVar3;
  representation_09.start_ = buffer_container;
  TrimRepresentation(representation_09);
  CheckEqualsHelper((char *)0xac,0xc0cfde,"2147483648",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xad,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_19._8_8_ = value_source;
  buffer_19.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,2147483648.0,5,requested_digits,buffer_19,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(5) >= (length)";
  CheckHelper((char *)0xb1,0xc0ce9a,(char *)(ulong)(length < 6),(bool)uVar1);
  representation_10._8_8_ = pcVar3;
  representation_10.start_ = buffer_container;
  TrimRepresentation(representation_10);
  CheckEqualsHelper((char *)0xb3,0xc0d00e,"21475",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0xb4,0xc0df44,(char *)0xa,point,(char *)piVar4,(int)piVar5);
  buffer_20._8_8_ = value_source;
  buffer_20.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,3.5844466002796428e+298,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_20,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xb8,0xc0d016,"35844466002796428",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xb9,0xaf8c1d,(char *)0x12b,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_21._8_8_ = value_source;
  buffer_21.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,3.5844466002796428e+298,10,requested_digits,buffer_21,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(10) >= (length)";
  CheckHelper((char *)0xbd,0xc0ce65,(char *)(ulong)(length < 0xb),(bool)uVar1);
  representation_11._8_8_ = pcVar3;
  representation_11.start_ = buffer_container;
  TrimRepresentation(representation_11);
  CheckEqualsHelper((char *)0xbf,0xc0d03c,"35844466",buffer_container,(char *)piVar4,(char *)piVar5)
  ;
  CheckEqualsHelper((char *)0xc0,0xaf8c1d,(char *)0x12b,point,(char *)piVar4,(int)piVar5);
  uVar2 = 100;
  buffer_22._8_8_ = value_source;
  buffer_22.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,1e-23,BIGNUM_DTOA_SHORTEST,requested_digits,buffer_22,
             length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xc4,0xc080e4,"1",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0xc5,0xc1dcc6,(char *)0xffffffffffffffea,point,(char *)piVar4,
                    (int)piVar5);
  buffer_23._8_8_ = value_source;
  buffer_23.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,2.2250738585072014e-308,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_23,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xca,0xc0d050,"22250738585072014",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xcb,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_24._8_8_ = value_source;
  buffer_24.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,2.2250738585072014e-308,0x14,requested_digits,buffer_24,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(20) >= (length)";
  CheckHelper((char *)0xce,0xc0cf69,(char *)(ulong)(length < 0x15),(bool)uVar1);
  representation_12._8_8_ = pcVar3;
  representation_12.start_ = buffer_container;
  TrimRepresentation(representation_12);
  CheckEqualsHelper((char *)0xd0,0xc0d07b,"22250738585072013831",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xd1,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar5);
  buffer_25._8_8_ = value_source;
  buffer_25.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,2.225073858507201e-308,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_25,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xd6,0xc0d0a7,"2225073858507201",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xd7,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_26._8_8_ = value_source;
  buffer_26.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,2.225073858507201e-308,0x14,requested_digits,buffer_26,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(20) >= (length)";
  CheckHelper((char *)0xda,0xc0cf69,(char *)(ulong)(length < 0x15),(bool)uVar1);
  representation_13._8_8_ = pcVar3;
  representation_13.start_ = buffer_container;
  TrimRepresentation(representation_13);
  CheckEqualsHelper((char *)0xdc,0xc0d0cb,"2225073858507200889",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xdd,0xc0d076,(char *)0xfffffecd,point,(char *)piVar4,(int)piVar5);
  buffer_27._8_8_ = value_source;
  buffer_27.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,4.128420500802942e-09,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_27,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xe1,0xc0d0f5,"4128420500802942",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xe2,0xc11381,(char *)0xfffffffffffffff8,point,(char *)piVar4,
                    (int)piVar5);
  buffer_28._8_8_ = value_source;
  buffer_28.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x0,3.9292015898194143e-10,BIGNUM_DTOA_SHORTEST,requested_digits,
             buffer_28,length_00,in_stack_ffffffffffffff58);
  CheckEqualsHelper((char *)0xe6,0xc0d119,"39292015898194143",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  uVar1 = 100;
  buffer_29._8_8_ = value_source;
  buffer_29.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,4194304.0,5,requested_digits,buffer_29,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(5) >= (length - point)";
  CheckHelper((char *)0xea,0xc0ce7f,(char *)(ulong)(length - point < 6),(bool)uVar1);
  representation_14._8_8_ = pcVar3;
  representation_14.start_ = buffer_container;
  TrimRepresentation(representation_14);
  CheckEqualsHelper((char *)0xec,0xc0d13f,"4194304",buffer_container,(char *)piVar4,(char *)piVar5);
  uVar1 = 100;
  buffer_30._8_8_ = value_source;
  buffer_30.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,3.316133905216739e-237,0x13,requested_digits,buffer_30,
             length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(19) >= (length)";
  CheckHelper((char *)0xf0,0xc0d151,(char *)(ulong)(length < 0x14),(bool)uVar1);
  representation_15._8_8_ = pcVar3;
  representation_15.start_ = buffer_container;
  TrimRepresentation(representation_15);
  CheckEqualsHelper((char *)0xf2,0xc0d162,"3316133905216739056",buffer_container,(char *)piVar4,
                    (char *)piVar5);
  CheckEqualsHelper((char *)0xf3,0xc0d18c,(char *)0xffffff14,point,(char *)piVar4,(int)piVar5);
  buffer_31._8_8_ = value_source;
  buffer_31.start_ = (char *)0x64;
  piVar4 = value_source;
  piVar5 = length_00;
  double_conversion::BignumDtoa
            ((double_conversion *)0x3,7.98851839160081e+191,4,requested_digits,buffer_31,length_00,
             in_stack_ffffffffffffff58);
  pcVar3 = "(4) >= (length)";
  CheckHelper((char *)0xf7,0xc0d191,(char *)(ulong)(length < 5),(bool)uVar2);
  representation_16._8_8_ = pcVar3;
  representation_16.start_ = buffer_container;
  TrimRepresentation(representation_16);
  CheckEqualsHelper((char *)0xf9,0xc0d1a1,"7989",buffer_container,(char *)piVar4,(char *)piVar5);
  CheckEqualsHelper((char *)0xfa,0xa06cca,(char *)0xc0,point,(char *)piVar4,(int)piVar5);
  uVar1 = 100;
  buffer_32._8_8_ = value_source;
  buffer_32.start_ = (char *)0x64;
  double_conversion::BignumDtoa
            ((double_conversion *)0x2,1.0000000000000013e+17,BIGNUM_DTOA_SHORTEST_SINGLE,
             requested_digits,buffer_32,length_00,in_stack_ffffffffffffff58);
  pcVar3 = "(1) >= (length - point)";
  CheckHelper((char *)0xfe,0xc0d1a8,(char *)(ulong)(length - point < 2),(bool)uVar1);
  representation_17._8_8_ = pcVar3;
  representation_17.start_ = buffer_container;
  TrimRepresentation(representation_17);
  CheckEqualsHelper((char *)0x100,0xc0d1c0,"100000000000000128",buffer_container,
                    (char *)value_source,(char *)length_00);
  CheckEqualsHelper((char *)0x101,0xc1ab38,(char *)0x12,point,(char *)value_source,(int)length_00);
  return;
}

Assistant:

TEST(BignumDtoaVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  BignumDtoa(1.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_FIXED, 3, buffer, &length, &point);
  CHECK_GE(3, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.0, BIGNUM_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK_GE(3, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_FIXED, 10, buffer, &length, &point);
  CHECK_GE(10, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  BignumDtoa(1.5, BIGNUM_DTOA_PRECISION, 10, buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("15", buffer.start());
  CHECK_EQ(1, point);

  double min_double = 5e-324;
  BignumDtoa(min_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("5", buffer.start());
  CHECK_EQ(-323, point);

  BignumDtoa(min_double, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("", buffer.start());

  BignumDtoa(min_double, BIGNUM_DTOA_PRECISION, 5, buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  BignumDtoa(max_double, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("17976931348623157", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(max_double, BIGNUM_DTOA_PRECISION, 7, buffer, &length, &point);
  CHECK_GE(7, length);
  TrimRepresentation(buffer);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4294967272.0, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_EQ("429496727200000", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(4294967272.0, BIGNUM_DTOA_PRECISION, 14, buffer, &length, &point);
  CHECK_GE(14, length);
  TrimRepresentation(buffer);
  CHECK_EQ("4294967272", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4185580496821357", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(4.1855804968213567e298, BIGNUM_DTOA_PRECISION, 20,
             buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("41855804968213567225", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("5562684646268003", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(5.5626846462680035e-309, BIGNUM_DTOA_PRECISION, 1,
             buffer, &length, &point);
  CHECK_GE(1, length);
  TrimRepresentation(buffer);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);


  BignumDtoa(2147483648.0, BIGNUM_DTOA_FIXED, 2,
             buffer, &length, &point);
  CHECK_GE(2, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("2147483648", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(2147483648.0, BIGNUM_DTOA_PRECISION, 5,
             buffer, &length, &point);
  CHECK_GE(5, length);
  TrimRepresentation(buffer);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("35844466002796428", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(3.5844466002796428e+298, BIGNUM_DTOA_PRECISION, 10,
             buffer, &length, &point);
  CHECK_GE(10, length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  BignumDtoa(1e-23, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-22, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072013831", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("2225073858507201", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 20, buffer, &length, &point);
  CHECK_GE(20, length);
  TrimRepresentation(buffer);
  CHECK_EQ("2225073858507200889", buffer.start());
  CHECK_EQ(-307, point);

  BignumDtoa(4128420500802942e-24, BIGNUM_DTOA_SHORTEST, 0,
             buffer, &length, &point);
  CHECK_EQ("4128420500802942", buffer.start());
  CHECK_EQ(-8, point);

  v = 3.9292015898194142585311918e-10;
  BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
  CHECK_EQ("39292015898194143", buffer.start());

  v = 4194304.0;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 5, buffer, &length, &point);
  CHECK_GE(5, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("4194304", buffer.start());

  v = 3.3161339052167390562200598e-237;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 19, buffer, &length, &point);
  CHECK_GE(19, length);
  TrimRepresentation(buffer);
  CHECK_EQ("3316133905216739056", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  BignumDtoa(v, BIGNUM_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK_GE(4, length);
  TrimRepresentation(buffer);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);

  v = 1.0000000000000012800000000e+17;
  BignumDtoa(v, BIGNUM_DTOA_FIXED, 1, buffer, &length, &point);
  CHECK_GE(1, length - point);
  TrimRepresentation(buffer);
  CHECK_EQ("100000000000000128", buffer.start());
  CHECK_EQ(18, point);
}